

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tccelf.c
# Opt level: O3

int tcc_object_type(int fd,Elf64_Ehdr *h)

{
  int iVar1;
  ssize_t sVar2;
  
  sVar2 = read(fd,h,0x40);
  if (((int)sVar2 == 0x40) && (*(int *)h->e_ident == 0x464c457f)) {
    iVar1 = 1;
    if (h->e_type != 1) {
      iVar1 = (uint)(h->e_type == 3) * 2;
    }
  }
  else if (((int)sVar2 < 8) || (*(long *)h->e_ident != 0xa3e686372613c21)) {
    iVar1 = 0;
  }
  else {
    iVar1 = 3;
  }
  return iVar1;
}

Assistant:

ST_FUNC int tcc_object_type(int fd, ElfW(Ehdr) * h) {
  int size = read(fd, h, sizeof *h);
  if (size == sizeof *h && 0 == memcmp(h, ELFMAG, 4)) {
    if (h->e_type == ET_REL)
      return AFF_BINTYPE_REL;
    if (h->e_type == ET_DYN)
      return AFF_BINTYPE_DYN;
  } else if (size >= 8) {
    if (0 == memcmp(h, ARMAG, 8))
      return AFF_BINTYPE_AR;
#ifdef TCC_TARGET_COFF
    if (((struct filehdr*)h)->f_magic == COFF_C67_MAGIC)
      return AFF_BINTYPE_C67;
#endif
  }
  return 0;
}